

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

string * __thiscall Tokens::the_rest_abi_cxx11_(string *__return_storage_ptr__,Tokens *this)

{
  ulong uVar1;
  pointer pbVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  string *in_R8;
  allocator local_41;
  string local_40 [32];
  
  uVar1 = this->fIndex;
  pbVar2 = (this->fTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iter._M_current =
       (this->fTokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar1 < (ulong)((long)iter._M_current - (long)pbVar2 >> 5)) {
    std::__cxx11::string::string(local_40," ",&local_41);
    (anonymous_namespace)::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(pbVar2 + uVar1),iter,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,in_R8);
    std::__cxx11::string::~string(local_40);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string the_rest() const {
		if (!*this)
			return {};
		return join(fTokens.begin()+fIndex,
			    fTokens.end(),
			    " ");
	}